

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integral_image_simd.cpp
# Opt level: O3

void compute_integral_img_simd_early_cast_int(uint8_t *gray_image,integral_image *iimage)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  float *pfVar4;
  float *pfVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  undefined1 auVar19 [32];
  undefined8 uVar20;
  uint uVar21;
  byte bVar22;
  byte bVar23;
  long lVar24;
  ulong uVar25;
  float fVar26;
  float *pfVar27;
  long lVar28;
  ulong uVar29;
  uint8_t *puVar30;
  uint uVar31;
  ulong uVar32;
  int iVar33;
  float *pfVar34;
  float *pfVar35;
  long lVar36;
  ushort uVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [32];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [16];
  undefined1 in_XMM8 [16];
  
  auVar19 = _DAT_001a26a0;
  iVar1 = iimage->data_width;
  lVar24 = (long)iVar1;
  uVar2 = iimage->height;
  uVar3 = iimage->width;
  uVar25 = (ulong)(int)uVar3;
  pfVar4 = iimage->data;
  uVar31 = uVar3 + 3;
  uVar21 = uVar3;
  if ((long)uVar25 < 0) {
    uVar21 = uVar31;
  }
  if (uVar31 < 7) {
    uVar32 = 0;
  }
  else {
    auVar41 = ZEXT1664((undefined1  [16])0x0);
    uVar32 = 0;
    do {
      auVar40 = vpermt2b_avx512vl(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar19,
                                  ZEXT432(*(uint *)(gray_image + uVar32)));
      auVar40 = vpsadbw_avx2(auVar40,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
      auVar40 = vpaddd_avx2(auVar40,auVar41._0_32_);
      auVar38 = vpmovqd_avx512vl(auVar40);
      *(undefined1 (*) [16])(pfVar4 + uVar32) = auVar38;
      auVar40 = vpermq_avx2(auVar40,0xff);
      auVar41 = ZEXT3264(auVar40);
      uVar32 = uVar32 + 4;
    } while (uVar32 < (ulong)(long)(int)(uVar21 & 0xfffffffc));
  }
  if (uVar32 < uVar25) {
    fVar26 = pfVar4[uVar32 - 1];
    do {
      fVar26 = (float)((int)fVar26 + (uint)gray_image[uVar32]);
      pfVar4[uVar32] = fVar26;
      uVar32 = uVar32 + 1;
    } while (uVar25 != uVar32);
  }
  auVar19 = _DAT_001a26a0;
  pfVar5 = iimage->data;
  if (1 < uVar2) {
    puVar30 = gray_image + uVar25;
    lVar36 = 1;
    pfVar34 = pfVar4;
    pfVar35 = pfVar5;
    pfVar27 = pfVar4;
    do {
      pfVar27 = pfVar27 + lVar24;
      if (uVar31 < 7) {
        uVar32 = 0;
      }
      else {
        auVar41 = ZEXT1664((undefined1  [16])0x0);
        uVar32 = 0;
        do {
          auVar40 = vpermt2b_avx512vl(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar19,
                                      ZEXT432(*(uint *)(puVar30 + uVar32)));
          auVar40 = vpsadbw_avx2(auVar40,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
          auVar40 = vpaddd_avx2(auVar40,auVar41._0_32_);
          auVar39 = vpmovqd_avx512vl(auVar40);
          auVar40 = vpermq_avx2(auVar40,0xff);
          auVar41 = ZEXT3264(auVar40);
          auVar38 = vcvtdq2ps_avx(*(undefined1 (*) [16])(pfVar34 + uVar32));
          auVar39 = vpaddd_avx(*(undefined1 (*) [16])(pfVar34 + uVar32),auVar39);
          auVar47._0_4_ = auVar38._0_4_ * 0.003921569;
          auVar47._4_4_ = auVar38._4_4_ * 0.003921569;
          auVar47._8_4_ = auVar38._8_4_ * 0.003921569;
          auVar47._12_4_ = auVar38._12_4_ * 0.003921569;
          *(undefined1 (*) [16])(pfVar35 + uVar32) = auVar47;
          *(undefined1 (*) [16])(pfVar27 + uVar32) = auVar39;
          uVar32 = uVar32 + 4;
        } while (uVar32 < (ulong)(long)(int)(uVar21 & 0xfffffffc));
      }
      lVar28 = (lVar36 + -1) * lVar24;
      if (uVar32 < uVar25) {
        iVar33 = (int)pfVar4[lVar36 * lVar24 + (uVar32 - 1)] - (int)pfVar4[lVar28 + (uVar32 - 1)];
        do {
          auVar38 = vcvtusi2ss_avx512f(in_XMM8,pfVar4[lVar28 + uVar32]);
          iVar33 = iVar33 + (uint)puVar30[uVar32];
          auVar39 = vcvtusi2ss_avx512f(in_XMM8,iVar33);
          fVar26 = (float)vcvttss2usi_avx512f(ZEXT416((uint)(auVar38._0_4_ + auVar39._0_4_)));
          pfVar4[lVar36 * lVar24 + uVar32] = fVar26;
          pfVar5[lVar28 + uVar32] = auVar38._0_4_ * 0.003921569;
          uVar32 = uVar32 + 1;
        } while (uVar32 != uVar25);
      }
      lVar36 = lVar36 + 1;
      pfVar35 = pfVar35 + lVar24;
      pfVar34 = pfVar34 + lVar24;
      puVar30 = puVar30 + uVar25;
    } while (lVar36 != (int)uVar2);
  }
  if (uVar3 - 7 == 0) {
    uVar32 = 0;
  }
  else {
    lVar24 = (long)(int)((uVar2 - 1) * iVar1);
    uVar32 = 0;
    do {
      auVar19 = vcvtdq2ps_avx(*(undefined1 (*) [32])(pfVar4 + lVar24 + uVar32));
      pfVar27 = pfVar5 + lVar24 + uVar32;
      *pfVar27 = auVar19._0_4_ * 0.003921569;
      pfVar27[1] = auVar19._4_4_ * 0.003921569;
      pfVar27[2] = auVar19._8_4_ * 0.003921569;
      pfVar27[3] = auVar19._12_4_ * 0.003921569;
      pfVar27[4] = auVar19._16_4_ * 0.003921569;
      pfVar27[5] = auVar19._20_4_ * 0.003921569;
      pfVar27[6] = auVar19._24_4_ * 0.003921569;
      pfVar27[7] = auVar19._28_4_;
      uVar32 = uVar32 + 8;
    } while (uVar32 < (ulong)(long)(int)(uVar3 - 7));
  }
  if (uVar32 <= uVar25 && uVar25 - uVar32 != 0) {
    auVar41 = vbroadcastss_avx512f(ZEXT416(0x3b808081));
    auVar42 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar43 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar44 = vpbroadcastq_avx512f();
    lVar24 = uVar32 + (long)(int)((uVar2 - 1) * iVar1);
    uVar29 = 0;
    do {
      auVar45 = vpbroadcastq_avx512f();
      auVar46 = vporq_avx512f(auVar45,auVar42);
      auVar45 = vporq_avx512f(auVar45,auVar43);
      uVar20 = vpcmpuq_avx512f(auVar45,auVar44,2);
      bVar22 = (byte)uVar20;
      uVar20 = vpcmpuq_avx512f(auVar46,auVar44,2);
      bVar23 = (byte)uVar20;
      uVar37 = CONCAT11(bVar23,bVar22);
      auVar45 = vmovdqu32_avx512f(*(undefined1 (*) [64])(pfVar4 + lVar24 + uVar29));
      auVar46._4_4_ = (uint)((byte)(uVar37 >> 1) & 1) * auVar45._4_4_;
      auVar46._0_4_ = (uint)(bVar22 & 1) * auVar45._0_4_;
      auVar46._8_4_ = (uint)((byte)(uVar37 >> 2) & 1) * auVar45._8_4_;
      auVar46._12_4_ = (uint)((byte)(uVar37 >> 3) & 1) * auVar45._12_4_;
      auVar46._16_4_ = (uint)((byte)(uVar37 >> 4) & 1) * auVar45._16_4_;
      auVar46._20_4_ = (uint)((byte)(uVar37 >> 5) & 1) * auVar45._20_4_;
      auVar46._24_4_ = (uint)((byte)(uVar37 >> 6) & 1) * auVar45._24_4_;
      auVar46._28_4_ = (uint)((byte)(uVar37 >> 7) & 1) * auVar45._28_4_;
      auVar46._32_4_ = (uint)(bVar23 & 1) * auVar45._32_4_;
      auVar46._36_4_ = (uint)(bVar23 >> 1 & 1) * auVar45._36_4_;
      auVar46._40_4_ = (uint)(bVar23 >> 2 & 1) * auVar45._40_4_;
      auVar46._44_4_ = (uint)(bVar23 >> 3 & 1) * auVar45._44_4_;
      auVar46._48_4_ = (uint)(bVar23 >> 4 & 1) * auVar45._48_4_;
      auVar46._52_4_ = (uint)(bVar23 >> 5 & 1) * auVar45._52_4_;
      auVar46._56_4_ = (uint)(bVar23 >> 6 & 1) * auVar45._56_4_;
      auVar46._60_4_ = (uint)(bVar23 >> 7) * auVar45._60_4_;
      auVar45 = vcvtudq2ps_avx512f(auVar46);
      auVar45 = vmulps_avx512f(auVar45,auVar41);
      pfVar27 = pfVar5 + lVar24 + uVar29;
      bVar6 = (bool)((byte)(uVar37 >> 1) & 1);
      bVar7 = (bool)((byte)(uVar37 >> 2) & 1);
      bVar8 = (bool)((byte)(uVar37 >> 3) & 1);
      bVar9 = (bool)((byte)(uVar37 >> 4) & 1);
      bVar10 = (bool)((byte)(uVar37 >> 5) & 1);
      bVar11 = (bool)((byte)(uVar37 >> 6) & 1);
      bVar12 = (bool)((byte)(uVar37 >> 7) & 1);
      bVar13 = (bool)(bVar23 >> 1 & 1);
      bVar14 = (bool)(bVar23 >> 2 & 1);
      bVar15 = (bool)(bVar23 >> 3 & 1);
      bVar16 = (bool)(bVar23 >> 4 & 1);
      bVar17 = (bool)(bVar23 >> 5 & 1);
      bVar18 = (bool)(bVar23 >> 6 & 1);
      *pfVar27 = (float)((uint)(bVar22 & 1) * auVar45._0_4_ |
                        (uint)!(bool)(bVar22 & 1) * (int)*pfVar27);
      pfVar27[1] = (float)((uint)bVar6 * auVar45._4_4_ | (uint)!bVar6 * (int)pfVar27[1]);
      pfVar27[2] = (float)((uint)bVar7 * auVar45._8_4_ | (uint)!bVar7 * (int)pfVar27[2]);
      pfVar27[3] = (float)((uint)bVar8 * auVar45._12_4_ | (uint)!bVar8 * (int)pfVar27[3]);
      pfVar27[4] = (float)((uint)bVar9 * auVar45._16_4_ | (uint)!bVar9 * (int)pfVar27[4]);
      pfVar27[5] = (float)((uint)bVar10 * auVar45._20_4_ | (uint)!bVar10 * (int)pfVar27[5]);
      pfVar27[6] = (float)((uint)bVar11 * auVar45._24_4_ | (uint)!bVar11 * (int)pfVar27[6]);
      pfVar27[7] = (float)((uint)bVar12 * auVar45._28_4_ | (uint)!bVar12 * (int)pfVar27[7]);
      pfVar27[8] = (float)((uint)(bVar23 & 1) * auVar45._32_4_ |
                          (uint)!(bool)(bVar23 & 1) * (int)pfVar27[8]);
      pfVar27[9] = (float)((uint)bVar13 * auVar45._36_4_ | (uint)!bVar13 * (int)pfVar27[9]);
      pfVar27[10] = (float)((uint)bVar14 * auVar45._40_4_ | (uint)!bVar14 * (int)pfVar27[10]);
      pfVar27[0xb] = (float)((uint)bVar15 * auVar45._44_4_ | (uint)!bVar15 * (int)pfVar27[0xb]);
      pfVar27[0xc] = (float)((uint)bVar16 * auVar45._48_4_ | (uint)!bVar16 * (int)pfVar27[0xc]);
      pfVar27[0xd] = (float)((uint)bVar17 * auVar45._52_4_ | (uint)!bVar17 * (int)pfVar27[0xd]);
      pfVar27[0xe] = (float)((uint)bVar18 * auVar45._56_4_ | (uint)!bVar18 * (int)pfVar27[0xe]);
      pfVar27[0xf] = (float)((uint)(bVar23 >> 7) * auVar45._60_4_ |
                            (uint)!(bool)(bVar23 >> 7) * (int)pfVar27[0xf]);
      uVar29 = uVar29 + 0x10;
    } while (((uVar25 - uVar32) + 0xf & 0xfffffffffffffff0) != uVar29);
  }
  return;
}

Assistant:

void compute_integral_img_simd_early_cast_int(uint8_t *gray_image, struct integral_image *iimage) {
    
    // Implementation adapted from:
    // https://stackoverflow.com/questions/46520275/how-to-speed-up-calculation-of-integral-image
    // https://github.com/ermig1979/Simd/blob/master/src/Simd/SimdAvx2Integral.cpp

    int data_width = iimage->data_width;
    int width = iimage->width;
    int height = iimage->height;

    __m256i MASK = _mm256_setr_epi64x(0x00000000000000FF, 0x000000000000FFFF, 0x0000000000FFFFFF, 0x00000000FFFFFFFF);
    __m256i PACK = _mm256_setr_epi32(0, 2, 4, 6, 1, 3, 5, 7);
    //__m256i ZERO = _mm256_set1_epi32(0);
    __m256i ZERO = _mm256_setzero_si256();

    uint32_t *iimage_idata = (uint32_t *) iimage->data;

    size_t aligned_width = width / 4 * 4;

    {
        __m256i row_sums = ZERO;
        size_t i = 0;
        for(; i < aligned_width; i+=4) {

            // If (gray_image + i) has following uint8_t pixels: a b c d
            // a0000000 ab000000 abc00000 abcd0000
            __m256i img_rep_mask = _mm256_and_si256(_mm256_set1_epi32(*(uint32_t*)(gray_image + i)), MASK);
            
            // Summing together blocks of 8 uint8_t's and storing results
            // uint32_t eeee = a
            // uint32_t ffff = a + b
            // uint32_t gggg = a + b + c
            // uint32_t hhhh = a + b + c + d
            // eeee0000 ffff0000 gggg0000 hhhh0000
            __m256i img_sad_sum = _mm256_sad_epu8(img_rep_mask, ZERO);

            // Updating row_sum by adding previously computed img_sad_sum
            //   eeee0000 ffff0000 hhhh0000 hhhh0000
            // + iiii**** jjjj**** kkkk**** llll****
            // -------------------------------------
            //   mmmm**** nnnn**** oooo**** pppp****
            row_sums = _mm256_add_epi32(row_sums, img_sad_sum);

            // Permuting row_sum from first row to second and cutting off upper 128 bits
            // mmmm**** nnnn**** oooo**** pppp****
            // mmmmnnnn oooopppp ******** ********
            __m128i curr_row_sums = _mm256_castsi256_si128(_mm256_permutevar8x32_epi32(row_sums, PACK));
            
            // Storing 128 bits (4*uint32_t) in curr_row_sums back to memory
            // 
            _mm_storeu_si128((__m128i*)(iimage_idata + i), curr_row_sums); // For unaligned
            //_mm_store_si128((__m128i *)(iimage_idata + i), curr_row_sums);
            
            // Updating row_sums to only include highest of four values (pppp)
            // mmmm**** nnnn**** oooo**** pppp****
            // pppp**** pppp**** pppp**** pppp****
            row_sums = _mm256_permute4x64_epi64(row_sums, 0xFF);

        }
        uint32_t row_sum = iimage_idata[i - 1];
        for (; i < width; ++i) {
            row_sum += gray_image[i];
            iimage_idata[i] = row_sum;
        }
    }

    float *iimage_data = iimage->data;
    __m128 factor = _mm_set1_ps(1.0f / 255.0f);

    for(size_t j = 1; j < height; ++j) {

        __m256i row_sums = ZERO;

        size_t i = 0;
        for(; i < aligned_width; i+=4) {

            // If (gray_image + i) has following uint8_t pixels: a b c d
            // a0000000 ab000000 abc00000 abcd0000
            __m256i img_rep_mask = _mm256_and_si256(_mm256_set1_epi32(*(uint32_t*)(gray_image + j * width + i)), MASK);
            
            // Summing together blocks of 8 uint8_t's and storing results
            // uint32_t eeee = a
            // uint32_t ffff = a + b
            // uint32_t gggg = a + b + c
            // uint32_t hhhh = a + b + c + d
            // eeee0000 ffff0000 gggg0000 hhhh0000
            __m256i img_sad_sum = _mm256_sad_epu8(img_rep_mask, ZERO);

            // Updating row_sum by adding previously computed img_sad_sum
            //   eeee0000 ffff0000 hhhh0000 hhhh0000
            // + iiii**** jjjj**** kkkk**** llll****
            // -------------------------------------
            //   mmmm**** nnnn**** oooo**** pppp****
            row_sums = _mm256_add_epi32(row_sums, img_sad_sum);

            // Permuting row_sum from first row to second and cutting off upper 128 bits
            // mmmm**** nnnn**** oooo**** pppp****
            // mmmmnnnn oooopppp ******** ********
            __m128i curr_row_sums = _mm256_castsi256_si128(_mm256_permutevar8x32_epi32(row_sums, PACK));

            // Loading row_sum from previous row
            __m128i prev_row_sums = _mm_loadu_si128((__m128i *)(iimage_idata + (j-1) * data_width + i));
            //__m128i prev_row_sums = _mm_load_si128((__m128i *)(iimage_idata + (j-1) * data_width + i));

            // AVX512 only :(
            //__m128 prev_row_sums_cast = _mm_cvtepu32_ps(prev_row_sums);
            __m128 prev_row_sums_cast = _mm_cvtepi32_ps(prev_row_sums);
            //__128 prev_row_sums_cast = _my_mm_cvtepu32_ps(prev_row_sums);

            // Multiplying float version of previous row sum converted with (1.0f/255.0f) 
            __m128 prev_iimage_float = _mm_mul_ps(factor, prev_row_sums_cast);

            // Storing float of previous row sum back to memory as final integral image value
            _mm_storeu_ps(iimage_data +(j-1) * data_width + i, prev_iimage_float);

            // Adding curr_row_sums with prev_row_sums
            __m128i add_row_sums = _mm_add_epi32(curr_row_sums, prev_row_sums);

            // Storing 128 bits (4*uint32_t) in curr_row_sums back to memory
            _mm_storeu_si128((__m128i *)(iimage_idata + j * data_width + i), add_row_sums); // For unaligned
            //_mm_store_si128((__m128i *)(iimage_idata + j * data_width + i), add_row_sums);
            
            // Updating row_sums to only include highest of four values (pppp)
            // mmmm**** nnnn**** oooo**** pppp****
            // pppp**** pppp**** pppp**** pppp****
            row_sums = _mm256_permute4x64_epi64(row_sums, 0xFF);

        }

        uint32_t row_sum = iimage_idata[j * data_width + i - 1] - iimage_idata[(j-1) * data_width + i - 1];
        for (; i < width; ++i) {
            row_sum += gray_image[j * width + i];
            float prev_row_sum = iimage_idata[(j-1) * data_width + i];
            iimage_idata[j * data_width + i] = row_sum + prev_row_sum;
            iimage_data[(j-1) * data_width + i] = (1.0f / 255.0f) * ((float) prev_row_sum);
        }

    }

    // Converting last row to floats
    __m256 factor256 = _mm256_set1_ps(1.0f / 255.0f);
    size_t i = 0;
    for (; i < width - 7; i+=8) {

        __m256i v_int = _mm256_loadu_si256((__m256i *)(iimage_idata + (height - 1) * data_width + i));
        //__m256i v_int = _mm256_load_si256((__m256i *)(iimage_idata + j * data_width + i));

        // AVX512 only :(
        //__m256 v_float = _mm256_cvtepu32_ps(v_int);
        __m256 v_float = _mm256_cvtepi32_ps(v_int);
        //__m256 v_float = _my_mm256_cvtepu32_ps(v_int);

        // Multiplying converted float with (1.0f/255.0f) 
        __m256 v_iimage = _mm256_mul_ps(factor256, v_float);

        // Storing value back to memory
        _mm256_storeu_ps(iimage_data + (height - 1) * data_width + i, v_iimage);

    } 

    for (; i < width; ++i) {
        iimage_data[(height - 1) * data_width + i] = (1.0f / 255.0f) * ((float) iimage_idata[(height - 1) * data_width + i]);
    }

}